

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_input_pack16_avx512
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [64];
  long lVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float tmp [8] [8] [16];
  long local_1120;
  long local_1118;
  long local_1110;
  undefined1 auStack_1080 [64];
  undefined1 auStack_1040 [64];
  undefined1 auStack_1000 [64];
  undefined1 auStack_fc0 [64];
  undefined1 auStack_f80 [64];
  undefined1 auStack_f40 [64];
  undefined1 auStack_f00 [64];
  undefined1 auStack_ec0 [64];
  undefined1 auStack_e80 [512];
  undefined1 auStack_c80 [512];
  undefined1 auStack_a80 [512];
  undefined1 auStack_880 [512];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  
  iVar4 = bottom_blob->c;
  if (0 < (long)iVar4) {
    iVar5 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    uVar10 = (iVar6 + -2) / 6;
    uVar11 = (iVar5 + -2) / 6;
    iVar12 = uVar10 * uVar11;
    uVar18 = 1;
    if (1 < (int)uVar11) {
      uVar18 = (ulong)uVar11;
    }
    if ((int)uVar10 < 2) {
      uVar10 = 1;
    }
    auVar21 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
    auVar22 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
    auVar23 = vbroadcastss_avx512f(ZEXT416(0x3e800000));
    auVar24 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
    auVar25 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    auVar26 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    auVar28 = vbroadcastss_avx512f(ZEXT416(0x40800000));
    local_1120 = 0;
    do {
      if (7 < iVar6) {
        iVar7 = bottom_blob->w;
        sVar8 = bottom_blob->elemsize;
        local_1110 = (long)bottom_blob->data + sVar8 * bottom_blob->cstep * local_1120 + 0x1c0;
        lVar15 = bottom_blob_tm->elemsize * bottom_blob_tm->cstep * local_1120;
        pvVar9 = bottom_blob_tm->data;
        local_1118 = 0;
        uVar14 = 0;
        do {
          if (7 < iVar5) {
            uVar17 = 0;
            lVar16 = local_1118;
            do {
              pauVar19 = (undefined1 (*) [64])(((long)((uVar17 << 0x25) * 3) >> 0x1e) + local_1110);
              lVar13 = -0x200;
              do {
                auVar33 = pauVar19[-6];
                auVar32 = pauVar19[-5];
                auVar34 = pauVar19[-4];
                auVar1 = pauVar19[-3];
                auVar2 = pauVar19[-2];
                auVar3 = pauVar19[-1];
                auVar29 = vsubps_avx512f(auVar1,auVar32);
                auVar30 = vsubps_avx512f(pauVar19[-7],auVar3);
                auVar29 = vfmadd231ps_avx512f(auVar30,auVar21,auVar29);
                auVar30 = vsubps_avx512f(auVar34,auVar2);
                auVar31 = vsubps_avx512f(*pauVar19,auVar33);
                auVar30 = vfmadd231ps_avx512f(auVar31,auVar21,auVar30);
                *(undefined1 (*) [64])(auStack_e80 + lVar13) = auVar29;
                *(undefined1 (*) [64])(auStack_80 + lVar13) = auVar30;
                auVar29 = vaddps_avx512f(auVar3,auVar32);
                auVar29 = vfmadd231ps_avx512f(auVar29,auVar1,auVar22);
                auVar30 = vaddps_avx512f(auVar2,auVar33);
                auVar30 = vfmadd231ps_avx512f(auVar30,auVar34,auVar22);
                auVar31 = vaddps_avx512f(auVar29,auVar30);
                auVar29 = vsubps_avx512f(auVar29,auVar30);
                *(undefined1 (*) [64])(auStack_c80 + lVar13) = auVar31;
                *(undefined1 (*) [64])(auStack_a80 + lVar13) = auVar29;
                auVar29 = vfmadd231ps_avx512f(auVar3,auVar32,auVar23);
                auVar29 = vfmadd231ps_avx512f(auVar29,auVar1,auVar24);
                auVar30 = vmulps_avx512f(auVar33,auVar25);
                auVar30 = vfmadd231ps_avx512f(auVar30,auVar34,auVar26);
                auVar30 = vfmadd231ps_avx512f(auVar30,auVar2,auVar27);
                auVar31 = vaddps_avx512f(auVar29,auVar30);
                auVar29 = vsubps_avx512f(auVar29,auVar30);
                *(undefined1 (*) [64])(auStack_880 + lVar13) = auVar31;
                *(undefined1 (*) [64])(auStack_680 + lVar13) = auVar29;
                auVar32 = vfmadd213ps_avx512f(auVar1,auVar24,auVar32);
                auVar32 = vfmadd132ps_avx512f(auVar32,auVar3,auVar28);
                auVar33 = vaddps_avx512f(auVar33,auVar33);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar26,auVar34);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar25,auVar2);
                auVar34 = vaddps_avx512f(auVar32,auVar33);
                auVar33 = vsubps_avx512f(auVar32,auVar33);
                *(undefined1 (*) [64])(auStack_480 + lVar13) = auVar34;
                *(undefined1 (*) [64])(auStack_280 + lVar13) = auVar33;
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + (long)(iVar5 << 4) * 4);
                lVar13 = lVar13 + 0x40;
              } while (lVar13 != 0);
              lVar20 = 0;
              lVar13 = lVar16;
              do {
                auVar33 = *(undefined1 (*) [64])(auStack_1040 + lVar20);
                auVar32 = *(undefined1 (*) [64])(auStack_1000 + lVar20);
                auVar34 = *(undefined1 (*) [64])(auStack_fc0 + lVar20);
                auVar1 = *(undefined1 (*) [64])(auStack_f80 + lVar20);
                auVar2 = *(undefined1 (*) [64])(auStack_f40 + lVar20);
                auVar3 = *(undefined1 (*) [64])(auStack_f00 + lVar20);
                auVar29 = vsubps_avx512f(auVar1,auVar32);
                auVar30 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_1080 + lVar20),auVar3);
                auVar29 = vfmadd231ps_avx512f(auVar30,auVar21,auVar29);
                auVar30 = vsubps_avx512f(auVar34,auVar2);
                auVar31 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_ec0 + lVar20),auVar33);
                auVar30 = vfmadd231ps_avx512f(auVar31,auVar21,auVar30);
                auVar31 = vaddps_avx512f(auVar3,auVar32);
                auVar31 = vfmadd231ps_avx512f(auVar31,auVar1,auVar22);
                auVar35 = vaddps_avx512f(auVar2,auVar33);
                auVar35 = vfmadd231ps_avx512f(auVar35,auVar34,auVar22);
                auVar36 = vaddps_avx512f(auVar31,auVar35);
                auVar31 = vsubps_avx512f(auVar31,auVar35);
                auVar35 = vfmadd231ps_avx512f(auVar3,auVar32,auVar23);
                auVar35 = vfmadd231ps_avx512f(auVar35,auVar1,auVar24);
                auVar37 = vmulps_avx512f(auVar33,auVar25);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar34,auVar26);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar2,auVar27);
                auVar38 = vaddps_avx512f(auVar35,auVar37);
                auVar35 = vsubps_avx512f(auVar35,auVar37);
                auVar32 = vfmadd213ps_avx512f(auVar1,auVar24,auVar32);
                auVar32 = vfmadd132ps_avx512f(auVar32,auVar3,auVar28);
                auVar33 = vaddps_avx512f(auVar33,auVar33);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar26,auVar34);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar25,auVar2);
                auVar34 = vaddps_avx512f(auVar32,auVar33);
                auVar33 = vsubps_avx512f(auVar32,auVar33);
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + lVar15) = auVar29;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x10) * 4 + lVar15) =
                     auVar36;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x20) * 4 + lVar15) =
                     auVar31;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x30) * 4 + lVar15) =
                     auVar38;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x40) * 4 + lVar15) =
                     auVar35;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x50) * 4 + lVar15) =
                     auVar34;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x60) * 4 + lVar15) =
                     auVar33;
                *(undefined1 (*) [64])((long)pvVar9 + lVar13 + (long)(iVar12 * 0x70) * 4 + lVar15) =
                     auVar30;
                lVar20 = lVar20 + 0x200;
                lVar13 = lVar13 + (long)(iVar12 * 0x80) * 4;
              } while (lVar20 != 0x1000);
              uVar17 = uVar17 + 1;
              lVar16 = lVar16 + 0x40;
            } while (uVar17 != uVar18);
          }
          uVar14 = uVar14 + 1;
          local_1110 = local_1110 + (long)iVar7 * sVar8 * 6;
          local_1118 = local_1118 + (long)(int)uVar11 * 0x40;
        } while (uVar14 != uVar10);
      }
      local_1120 = local_1120 + 1;
    } while (local_1120 != iVar4);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack16_avx512(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(64))
#else
        __attribute__((aligned(64)))
#endif
        float tmp[8][8][16];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 16;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _r00 = _mm512_load_ps(r0);
                    __m512 _r01 = _mm512_load_ps(r0 + 16);
                    __m512 _r02 = _mm512_load_ps(r0 + 16 * 2);
                    __m512 _r03 = _mm512_load_ps(r0 + 16 * 3);
                    __m512 _r04 = _mm512_load_ps(r0 + 16 * 4);
                    __m512 _r05 = _mm512_load_ps(r0 + 16 * 5);
                    __m512 _r06 = _mm512_load_ps(r0 + 16 * 6);
                    __m512 _r07 = _mm512_load_ps(r0 + 16 * 7);

                    __m512 _tmp0m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r04, _r02), _mm512_sub_ps(_r00, _r06));
                    __m512 _tmp7m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r03, _r05), _mm512_sub_ps(_r07, _r01));
                    _mm512_store_ps(tmp[0][m], _tmp0m);
                    _mm512_store_ps(tmp[7][m], _tmp7m);

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r04, _mm512_add_ps(_r02, _r06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r03, _mm512_add_ps(_r01, _r05));

                    __m512 _tmp1m = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _tmp2m = _mm512_sub_ps(_tmp12a, _tmp12b);
                    _mm512_store_ps(tmp[1][m], _tmp1m);
                    _mm512_store_ps(tmp[2][m], _tmp2m);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _r02, _r06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(0.5f))));

                    __m512 _tmp3m = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _tmp4m = _mm512_sub_ps(_tmp34a, _tmp34b);
                    _mm512_store_ps(tmp[3][m], _tmp3m);
                    _mm512_store_ps(tmp[4][m], _tmp4m);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(2.f))));

                    __m512 _tmp5m = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _tmp6m = _mm512_sub_ps(_tmp56a, _tmp56b);
                    _mm512_store_ps(tmp[5][m], _tmp5m);
                    _mm512_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 16;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 16;
                float* r0_tm_1 = r0_tm_0 + tiles * 16;
                float* r0_tm_2 = r0_tm_0 + tiles * 16 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 16 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 16 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 16 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 16 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 16 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _tmp00 = _mm512_load_ps(tmp[m][0]);
                    __m512 _tmp01 = _mm512_load_ps(tmp[m][1]);
                    __m512 _tmp02 = _mm512_load_ps(tmp[m][2]);
                    __m512 _tmp03 = _mm512_load_ps(tmp[m][3]);
                    __m512 _tmp04 = _mm512_load_ps(tmp[m][4]);
                    __m512 _tmp05 = _mm512_load_ps(tmp[m][5]);
                    __m512 _tmp06 = _mm512_load_ps(tmp[m][6]);
                    __m512 _tmp07 = _mm512_load_ps(tmp[m][7]);

                    __m512 _r0tm0 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp04, _tmp02), _mm512_sub_ps(_tmp00, _tmp06));
                    __m512 _r0tm7 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp03, _tmp05), _mm512_sub_ps(_tmp07, _tmp01));

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp04, _mm512_add_ps(_tmp02, _tmp06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp03, _mm512_add_ps(_tmp01, _tmp05));

                    __m512 _r0tm1 = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _r0tm2 = _mm512_sub_ps(_tmp12a, _tmp12b);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _tmp02, _tmp06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(0.5f))));

                    __m512 _r0tm3 = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _r0tm4 = _mm512_sub_ps(_tmp34a, _tmp34b);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(2.f))));

                    __m512 _r0tm5 = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _r0tm6 = _mm512_sub_ps(_tmp56a, _tmp56b);

                    _mm512_store_ps(r0_tm_0, _r0tm0);
                    _mm512_store_ps(r0_tm_1, _r0tm1);
                    _mm512_store_ps(r0_tm_2, _r0tm2);
                    _mm512_store_ps(r0_tm_3, _r0tm3);
                    _mm512_store_ps(r0_tm_4, _r0tm4);
                    _mm512_store_ps(r0_tm_5, _r0tm5);
                    _mm512_store_ps(r0_tm_6, _r0tm6);
                    _mm512_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 128;
                    r0_tm_1 += tiles * 128;
                    r0_tm_2 += tiles * 128;
                    r0_tm_3 += tiles * 128;
                    r0_tm_4 += tiles * 128;
                    r0_tm_5 += tiles * 128;
                    r0_tm_6 += tiles * 128;
                    r0_tm_7 += tiles * 128;
                }
            }
        }
    }
}